

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutablePriorityQueue.h
# Opt level: O0

int __thiscall
CMU462::MutablePriorityQueue<CMU462::EdgeRecord>::remove
          (MutablePriorityQueue<CMU462::EdgeRecord> *this,char *__filename)

{
  bool bVar1;
  iterator this_00;
  undefined7 extraout_var;
  size_type sVar3;
  _Self in_stack_ffffffffffffffe0;
  _Self in_stack_ffffffffffffffe8;
  int iVar2;
  
  std::set<CMU462::EdgeRecord,_std::less<CMU462::EdgeRecord>,_std::allocator<CMU462::EdgeRecord>_>::
  find((set<CMU462::EdgeRecord,_std::less<CMU462::EdgeRecord>,_std::allocator<CMU462::EdgeRecord>_>
        *)in_stack_ffffffffffffffe8._M_node,(key_type *)in_stack_ffffffffffffffe0._M_node);
  this_00 = std::
            set<CMU462::EdgeRecord,_std::less<CMU462::EdgeRecord>,_std::allocator<CMU462::EdgeRecord>_>
            ::end(&this->queue);
  bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe8,(_Self *)&stack0xffffffffffffffe0);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    sVar3 = std::
            set<CMU462::EdgeRecord,_std::less<CMU462::EdgeRecord>,_std::allocator<CMU462::EdgeRecord>_>
            ::erase((set<CMU462::EdgeRecord,_std::less<CMU462::EdgeRecord>,_std::allocator<CMU462::EdgeRecord>_>
                     *)this_00._M_node,(key_type *)this);
    iVar2 = (int)sVar3;
  }
  return iVar2;
}

Assistant:

void remove(const T& item) {
    if (queue.find(item) != queue.end()) {
      queue.erase(item);
    }
  }